

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O0

int pmain(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  void *pvVar4;
  char *message;
  Proto *f_00;
  FILE *local_50;
  char *local_48;
  FILE *D;
  char *filename;
  int i;
  Proto *f;
  char **argv;
  int argc;
  lua_State *L_local;
  
  lVar3 = lua_tointegerx(L,1,(int *)0x0);
  iVar2 = (int)lVar3;
  pvVar4 = lua_touserdata(L,2);
  iVar1 = lua_checkstack(L,iVar2);
  if (iVar1 == 0) {
    fatal("too many input files");
  }
  for (filename._4_4_ = 0; filename._4_4_ < iVar2; filename._4_4_ = filename._4_4_ + 1) {
    iVar1 = strcmp(*(char **)((long)pvVar4 + (long)filename._4_4_ * 8),"-");
    if (iVar1 == 0) {
      local_48 = (char *)0x0;
    }
    else {
      local_48 = *(char **)((long)pvVar4 + (long)filename._4_4_ * 8);
    }
    iVar1 = luaL_loadfilex(L,local_48,(char *)0x0);
    if (iVar1 != 0) {
      message = lua_tolstring(L,-1,(size_t *)0x0);
      fatal(message);
    }
  }
  f_00 = combine(L,iVar2);
  if (listing != 0) {
    PrintFunction(f_00,(uint)(1 < listing));
  }
  if (dumping != 0) {
    if (output == (char *)0x0) {
      local_50 = _stdout;
    }
    else {
      local_50 = fopen64(output,"wb");
    }
    if (local_50 == (FILE *)0x0) {
      cannot("open");
    }
    luaU_dump(L,f_00,writer,local_50,stripping);
    iVar2 = ferror(local_50);
    if (iVar2 != 0) {
      cannot("write");
    }
    iVar2 = fclose(local_50);
    if (iVar2 != 0) {
      cannot("close");
    }
  }
  return 0;
}

Assistant:

static int pmain(lua_State *L) {
    int argc = (int) lua_tointeger(L, 1);
    char **argv = (char **) lua_touserdata(L, 2);
    const Proto *f;
    int i;
    if (!lua_checkstack(L, argc)) fatal("too many input files");
    for (i = 0; i < argc; i++) {
        const char *filename = IS("-") ? NULL : argv[i];
        if (luaL_loadfile(L, filename) != LUA_OK) fatal(lua_tostring(L, -1));
    }
    f = combine(L, argc);
    if (listing) luaU_print(f, listing > 1);
    if (dumping) {
        FILE *D = (output == NULL) ? stdout : fopen(output, "wb");
        if (D == NULL) cannot("open");
        lua_lock(L);
        luaU_dump(L, f, writer, D, stripping);
        lua_unlock(L);
        if (ferror(D)) cannot("write");
        if (fclose(D)) cannot("close");
    }
    return 0;
}